

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O0

void __thiscall
vector_block<unsigned_long,_1024U>::push_back
          (vector_block<unsigned_long,_1024U> *this,unsigned_long *t)

{
  unsigned_long uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  unsigned_long *t_local;
  vector_block<unsigned_long,_1024U> *this_local;
  
  bVar2 = is_full(this);
  if (bVar2) {
    puVar3 = (unsigned_long *)malloc(0x2000);
    this->_insertpos = puVar3;
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::push_back
              (&this->_index_block,&this->_insertpos);
    this->_left_in_block = 0x400;
  }
  uVar1 = *t;
  puVar3 = this->_insertpos;
  this->_insertpos = puVar3 + 1;
  *puVar3 = uVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(is_full(), false)) {
			_insertpos = static_cast<T*>(malloc(B*sizeof(T)));
			_index_block.push_back(_insertpos);
			_left_in_block = B;
		}
		*_insertpos++ = t;
		--_left_in_block;
	}